

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_7zip.c
# Opt level: O0

int make_streamsInfo(archive_write *a,uint64_t offset,uint64_t pack_size,uint64_t unpack_size,
                    int num_coder,coder *coders,int substrm,uint32_t header_crc)

{
  long lVar1;
  int iVar2;
  ssize_t sVar3;
  long in_RDI;
  int in_R8D;
  int *in_R9;
  int in_stack_00000008;
  uint8_t crc [4];
  file *file_1;
  uint codec_id;
  file *file;
  int r;
  int i;
  int codec_size;
  int fi;
  int numFolders;
  uint8_t codec_buff [8];
  _7zip_conflict *zip;
  uint64_t in_stack_ffffffffffffff78;
  void *in_stack_ffffffffffffff80;
  uint64_t in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff90;
  la_zaction in_stack_ffffffffffffff94;
  archive_write *in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffffa0;
  int in_stack_ffffffffffffffa8;
  uint in_stack_ffffffffffffffac;
  uint uVar4;
  int local_50;
  int local_4c;
  char local_48 [8];
  long local_40;
  int *local_38;
  int local_2c;
  int local_4;
  
  local_40 = *(long *)(in_RDI + 0xd0);
  if (*in_R9 == 0) {
    local_4c = (int)*(undefined8 *)(local_40 + 0x20);
  }
  else {
    local_4c = 1;
  }
  local_38 = in_R9;
  local_2c = in_R8D;
  local_4 = enc_uint64((archive_write *)
                       CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                       in_stack_ffffffffffffff88);
  if ((((-1 < local_4) &&
       (local_4 = enc_uint64((archive_write *)
                             CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                             in_stack_ffffffffffffff88), -1 < local_4)) &&
      (local_4 = enc_uint64((archive_write *)
                            CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                            in_stack_ffffffffffffff88), -1 < local_4)) &&
     (local_4 = enc_uint64((archive_write *)
                           CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                           in_stack_ffffffffffffff88), -1 < local_4)) {
    if (local_4c < 2) {
      iVar2 = enc_uint64((archive_write *)
                         CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                         in_stack_ffffffffffffff88);
      if (iVar2 < 0) {
        return iVar2;
      }
    }
    else {
      in_stack_ffffffffffffff98 = *(archive_write **)(local_40 + 0xf110);
      while ((in_stack_ffffffffffffff98 != (archive_write *)0x0 &&
             (lVar1._0_4_ = (in_stack_ffffffffffffff98->archive).file_count,
             lVar1._4_4_ = (in_stack_ffffffffffffff98->archive).archive_error_number, lVar1 != 0)))
      {
        iVar2 = enc_uint64((archive_write *)
                           CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                           in_stack_ffffffffffffff88);
        if (iVar2 < 0) {
          return iVar2;
        }
        in_stack_ffffffffffffff98 =
             (archive_write *)(in_stack_ffffffffffffff98->archive).archive_format_name;
      }
    }
    local_4 = enc_uint64((archive_write *)
                         CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                         in_stack_ffffffffffffff88);
    if (((-1 < local_4) &&
        (local_4 = enc_uint64((archive_write *)
                              CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                              in_stack_ffffffffffffff88), -1 < local_4)) &&
       ((local_4 = enc_uint64((archive_write *)
                              CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                              in_stack_ffffffffffffff88), -1 < local_4 &&
        ((local_4 = enc_uint64((archive_write *)
                               CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                               in_stack_ffffffffffffff88), -1 < local_4 &&
         (local_4 = enc_uint64((archive_write *)
                               CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                               in_stack_ffffffffffffff88), -1 < local_4)))))) {
      for (local_50 = 0; local_50 < local_4c; local_50 = local_50 + 1) {
        iVar2 = enc_uint64((archive_write *)
                           CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                           in_stack_ffffffffffffff88);
        if (iVar2 < 0) {
          return iVar2;
        }
        for (in_stack_ffffffffffffffa8 = 0; in_stack_ffffffffffffffa8 < local_2c;
            in_stack_ffffffffffffffa8 = in_stack_ffffffffffffffa8 + 1) {
          in_stack_ffffffffffffff94 = local_38[(long)in_stack_ffffffffffffffa8 * 6];
          archive_be64enc(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
          uVar4 = 8;
          while ((0 < (int)uVar4 && (local_48[(int)(8 - uVar4)] == '\0'))) {
            uVar4 = uVar4 - 1;
          }
          if (uVar4 == 0) {
            uVar4 = 1;
          }
          if (*(long *)(local_38 + (long)in_stack_ffffffffffffffa8 * 6 + 2) == 0) {
            iVar2 = enc_uint64((archive_write *)
                               CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                               in_stack_ffffffffffffff88);
          }
          else {
            iVar2 = enc_uint64((archive_write *)
                               CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                               in_stack_ffffffffffffff88);
          }
          if (iVar2 < 0) {
            return iVar2;
          }
          in_stack_ffffffffffffffac = uVar4 & 0xf;
          sVar3 = compress_out((archive_write *)
                               (CONCAT44(uVar4,in_stack_ffffffffffffffa8) & 0xfffffffff),
                               (void *)CONCAT44(iVar2,in_stack_ffffffffffffffa0),
                               (size_t)in_stack_ffffffffffffff98,in_stack_ffffffffffffff94);
          if ((int)sVar3 < 0) {
            return (int)sVar3;
          }
          if (*(long *)(local_38 + (long)in_stack_ffffffffffffffa8 * 6 + 2) != 0) {
            iVar2 = enc_uint64((archive_write *)
                               CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                               in_stack_ffffffffffffff88);
            if (iVar2 < 0) {
              return iVar2;
            }
            sVar3 = compress_out((archive_write *)
                                 CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
                                 (void *)CONCAT44(iVar2,in_stack_ffffffffffffffa0),
                                 (size_t)in_stack_ffffffffffffff98,in_stack_ffffffffffffff94);
            if ((int)sVar3 < 0) {
              return (int)sVar3;
            }
          }
        }
      }
      local_4 = enc_uint64((archive_write *)
                           CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                           in_stack_ffffffffffffff88);
      if (-1 < local_4) {
        if (local_4c < 2) {
          iVar2 = enc_uint64((archive_write *)
                             CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                             in_stack_ffffffffffffff88);
          if (iVar2 < 0) {
            return iVar2;
          }
        }
        else {
          for (in_stack_ffffffffffffff88 = *(uint64_t *)(local_40 + 0xf110);
              (in_stack_ffffffffffffff88 != 0 && (*(long *)(in_stack_ffffffffffffff88 + 0x30) != 0))
              ; in_stack_ffffffffffffff88 = *(uint64_t *)(in_stack_ffffffffffffff88 + 0x18)) {
            iVar2 = enc_uint64((archive_write *)
                               CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                               in_stack_ffffffffffffff88);
            if (iVar2 < 0) {
              return iVar2;
            }
          }
        }
        if (in_stack_00000008 == 0) {
          iVar2 = enc_uint64((archive_write *)
                             CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                             in_stack_ffffffffffffff88);
          if (iVar2 < 0) {
            return iVar2;
          }
          iVar2 = enc_uint64((archive_write *)
                             CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                             in_stack_ffffffffffffff88);
          if (iVar2 < 0) {
            return iVar2;
          }
          archive_le32enc(&stack0xffffffffffffff84,(uint32_t)file_1);
          sVar3 = compress_out((archive_write *)
                               CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
                               (void *)CONCAT44(iVar2,in_stack_ffffffffffffffa0),
                               (size_t)in_stack_ffffffffffffff98,in_stack_ffffffffffffff94);
          if ((int)sVar3 < 0) {
            return (int)sVar3;
          }
        }
        local_4 = enc_uint64((archive_write *)
                             CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                             in_stack_ffffffffffffff88);
        if ((-1 < local_4) &&
           (((in_stack_00000008 == 0 ||
             (local_4 = make_substreamsInfo(in_stack_ffffffffffffff98,
                                            (coder *)CONCAT44(in_stack_ffffffffffffff94,
                                                              in_stack_ffffffffffffff90)),
             -1 < local_4)) &&
            (local_4 = enc_uint64((archive_write *)
                                  CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                                  in_stack_ffffffffffffff88), -1 < local_4)))) {
          local_4 = 0;
        }
      }
    }
  }
  return local_4;
}

Assistant:

static int
make_streamsInfo(struct archive_write *a, uint64_t offset, uint64_t pack_size,
    uint64_t unpack_size, int num_coder, struct coder *coders, int substrm,
    uint32_t header_crc)
{
	struct _7zip *zip = (struct _7zip *)a->format_data;
	uint8_t codec_buff[8];
	int numFolders, fi;
	int codec_size;
	int i, r;

	if (coders->codec == _7Z_COPY)
		numFolders = (int)zip->total_number_nonempty_entry;
	else
		numFolders = 1;

	/*
	 * Make PackInfo.
	 */
	r = enc_uint64(a, kPackInfo);
	if (r < 0)
		return (r);

	/* Write PackPos. */
	r = enc_uint64(a, offset);
	if (r < 0)
		return (r);

	/* Write NumPackStreams. */
	r = enc_uint64(a, numFolders);
	if (r < 0)
		return (r);

	/* Make Size. */
	r = enc_uint64(a, kSize);
	if (r < 0)
		return (r);

	if (numFolders > 1) {
		struct file *file = zip->file_list.first;
		for (;file != NULL; file = file->next) {
			if (file->size == 0)
				break;
			r = enc_uint64(a, file->size);
			if (r < 0)
				return (r);
		}
	} else {
		/* Write size. */
		r = enc_uint64(a, pack_size);
		if (r < 0)
			return (r);
	}

	r = enc_uint64(a, kEnd);
	if (r < 0)
		return (r);

	/*
	 * Make UnPackInfo.
	 */
	r = enc_uint64(a, kUnPackInfo);
	if (r < 0)
		return (r);

	/*
	 * Make Folder.
	 */
	r = enc_uint64(a, kFolder);
	if (r < 0)
		return (r);

	/* Write NumFolders. */
	r = enc_uint64(a, numFolders);
	if (r < 0)
		return (r);

	/* Write External. */
	r = enc_uint64(a, 0);
	if (r < 0)
		return (r);

	for (fi = 0; fi < numFolders; fi++) {
		/* Write NumCoders. */
		r = enc_uint64(a, num_coder);
		if (r < 0)
			return (r);

		for (i = 0; i < num_coder; i++) {
			unsigned codec_id = coders[i].codec;

			/* Write Codec flag. */
			archive_be64enc(codec_buff, codec_id);
			for (codec_size = 8; codec_size > 0; codec_size--) {
				if (codec_buff[8 - codec_size])
					break;
			}
			if (codec_size == 0)
				codec_size = 1;
			if (coders[i].prop_size)
				r = enc_uint64(a, codec_size | 0x20);
			else
				r = enc_uint64(a, codec_size);
			if (r < 0)
				return (r);

			/* Write Codec ID. */
			codec_size &= 0x0f;
			r = (int)compress_out(a, &codec_buff[8-codec_size],
				codec_size, ARCHIVE_Z_RUN);
			if (r < 0)
				return (r);

			if (coders[i].prop_size) {
				/* Write Codec property size. */
				r = enc_uint64(a, coders[i].prop_size);
				if (r < 0)
					return (r);

				/* Write Codec properties. */
				r = (int)compress_out(a, coders[i].props,
					coders[i].prop_size, ARCHIVE_Z_RUN);
				if (r < 0)
					return (r);
			}
		}
	}

	/*
	 * Make CodersUnPackSize.
	 */
	r = enc_uint64(a, kCodersUnPackSize);
	if (r < 0)
		return (r);

	if (numFolders > 1) {
		struct file *file = zip->file_list.first;
		for (;file != NULL; file = file->next) {
			if (file->size == 0)
				break;
			r = enc_uint64(a, file->size);
			if (r < 0)
				return (r);
		}

	} else {
		/* Write UnPackSize. */
		r = enc_uint64(a, unpack_size);
		if (r < 0)
			return (r);
	}

	if (!substrm) {
		uint8_t crc[4];
		/*
		 * Make CRC.
		 */
		r = enc_uint64(a, kCRC);
		if (r < 0)
			return (r);

		/* All are defined */
		r = enc_uint64(a, 1);
		if (r < 0)
			return (r);
		archive_le32enc(crc, header_crc);
		r = (int)compress_out(a, crc, 4, ARCHIVE_Z_RUN);
		if (r < 0)
			return (r);
	}

	/* Write End. */
	r = enc_uint64(a, kEnd);
	if (r < 0)
		return (r);

	if (substrm) {
		/*
		 * Make SubStreamsInfo.
		 */
		r = make_substreamsInfo(a, coders);
		if (r < 0)
			return (r);
	}


	/* Write End. */
	r = enc_uint64(a, kEnd);
	if (r < 0)
		return (r);

	return (ARCHIVE_OK);
}